

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int re2::UnHex(int c)

{
  ostream *poVar1;
  int in_EDI;
  LogMessage *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  LogMessage *in_stack_fffffffffffffea0;
  int local_4;
  
  if ((in_EDI < 0x30) || (0x39 < in_EDI)) {
    if ((in_EDI < 0x41) || (0x46 < in_EDI)) {
      if ((in_EDI < 0x61) || (0x66 < in_EDI)) {
        LogMessage::LogMessage
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
        poVar1 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffe78);
        poVar1 = std::operator<<(poVar1,"Bad hex digit ");
        std::ostream::operator<<(poVar1,in_EDI);
        LogMessage::~LogMessage(in_stack_fffffffffffffe70);
        local_4 = 0;
      }
      else {
        local_4 = in_EDI + -0x57;
      }
    }
    else {
      local_4 = in_EDI + -0x37;
    }
  }
  else {
    local_4 = in_EDI + -0x30;
  }
  return local_4;
}

Assistant:

static int UnHex(int c) {
  if ('0' <= c && c <= '9')
    return c - '0';
  if ('A' <= c && c <= 'F')
    return c - 'A' + 10;
  if ('a' <= c && c <= 'f')
    return c - 'a' + 10;
  LOG(DFATAL) << "Bad hex digit " << c;
  return 0;
}